

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.h
# Opt level: O0

void __thiscall vpl::NameScope::AddVariable(NameScope *this,string *name)

{
  mapped_type mVar1;
  bool bVar2;
  ostream *poVar3;
  runtime_error *this_00;
  mapped_type *pmVar4;
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  key_type *local_18;
  string *name_local;
  NameScope *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  bVar2 = Contains(this,name);
  if (!bVar2) {
    mVar1 = this->total_size_;
    pmVar4 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->offsets_,local_18);
    *pmVar4 = mVar1;
    this->total_size_ = this->total_size_ + 1;
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar3 = std::operator<<(local_190,"Variable `");
  poVar3 = std::operator<<(poVar3,(string *)local_18);
  std::operator<<(poVar3,"` already exists");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(this_00,local_1d0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AddVariable(const std::string& name) {
        if (Contains(name)) {
            std::stringstream ss;
            ss << "Variable `" << name << "` already exists";
            throw std::runtime_error(ss.str());
        }
        offsets_[name] = total_size_;
        ++total_size_;
    }